

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

void __thiscall ON_ObjRef::ON_ObjRef(ON_ObjRef *this,ON_ObjRef *src)

{
  undefined8 uVar1;
  double dVar2;
  ON_COMPONENT_INDEX OVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  int iVar10;
  int iVar11;
  ON_ObjRef *src_local;
  ON_ObjRef *this_local;
  
  uVar8 = (src->m_uuid).Data2;
  uVar9 = (src->m_uuid).Data3;
  uVar1 = *(undefined8 *)(src->m_uuid).Data4;
  (this->m_uuid).Data1 = (src->m_uuid).Data1;
  (this->m_uuid).Data2 = uVar8;
  (this->m_uuid).Data3 = uVar9;
  *(undefined8 *)(this->m_uuid).Data4 = uVar1;
  this->m_geometry = src->m_geometry;
  this->m_parent_geometry = src->m_parent_geometry;
  this->m_component_index = src->m_component_index;
  this->m_geometry_type = src->m_geometry_type;
  this->m_runtime_sn = src->m_runtime_sn;
  (this->m_point).z = (src->m_point).z;
  dVar2 = (src->m_point).y;
  (this->m_point).x = (src->m_point).x;
  (this->m_point).y = dVar2;
  this->m_osnap_mode = src->m_osnap_mode;
  OVar3 = (src->m_evp).m_t_ci;
  *(undefined8 *)&(this->m_evp).field_0x50 = *(undefined8 *)&(src->m_evp).field_0x50;
  (this->m_evp).m_t_ci = OVar3;
  uVar1 = *(undefined8 *)&(src->m_evp).field_0x48;
  *(undefined8 *)&(this->m_evp).field_0x40 = *(undefined8 *)&(src->m_evp).field_0x40;
  *(undefined8 *)&(this->m_evp).field_0x48 = uVar1;
  iVar10 = (src->m_evp).m_t_type;
  iVar11 = (src->m_evp).m_reserved;
  dVar2 = (src->m_evp).m_t[0];
  dVar4 = (src->m_evp).m_t[1];
  dVar5 = (src->m_evp).m_t[2];
  dVar6 = (src->m_evp).m_t[3];
  uVar1 = *(undefined8 *)&(src->m_evp).field_0x28;
  uVar7 = *(undefined8 *)&(src->m_evp).field_0x38;
  *(undefined8 *)&(this->m_evp).field_0x30 = *(undefined8 *)&(src->m_evp).field_0x30;
  *(undefined8 *)&(this->m_evp).field_0x38 = uVar7;
  (this->m_evp).m_t[3] = dVar6;
  *(undefined8 *)&(this->m_evp).field_0x28 = uVar1;
  (this->m_evp).m_t[1] = dVar4;
  (this->m_evp).m_t[2] = dVar5;
  (this->m_evp).m_t_type = iVar10;
  (this->m_evp).m_reserved = iVar11;
  (this->m_evp).m_t[0] = dVar2;
  ON_SimpleArray<ON_ObjRef_IRefID>::ON_SimpleArray(&this->m__iref,&src->m__iref);
  this->m__proxy1 = src->m__proxy1;
  this->m__proxy2 = src->m__proxy2;
  this->m__proxy_ref_count = src->m__proxy_ref_count;
  if ((this->m__proxy_ref_count != (int *)0x0) && (0 < *this->m__proxy_ref_count)) {
    *this->m__proxy_ref_count = *this->m__proxy_ref_count + 1;
  }
  return;
}

Assistant:

ON_ObjRef::ON_ObjRef( const ON_ObjRef& src ) 
          : m_uuid(src.m_uuid),
            m_geometry(src.m_geometry),
            m_parent_geometry(src.m_parent_geometry),
            m_component_index(src.m_component_index),
            m_geometry_type(src.m_geometry_type),
            m_runtime_sn(src.m_runtime_sn),
            m_point(src.m_point),
            m_osnap_mode(src.m_osnap_mode),
            m_evp(src.m_evp),
            m__iref(src.m__iref),
            m__proxy1(src.m__proxy1),
            m__proxy2(src.m__proxy2),
            m__proxy_ref_count(src.m__proxy_ref_count)
{
  if ( m__proxy_ref_count && *m__proxy_ref_count > 0 )
  {
    *m__proxy_ref_count = *m__proxy_ref_count + 1;
  }
}